

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::root(precise_unit *un,int power)

{
  unit_data uVar1;
  ulong uVar2;
  double dVar3;
  precise_unit pVar4;
  unit_data local_14;
  
  if (power == 0) {
    dVar3 = 1.0;
    uVar2 = 0;
  }
  else if (((power & 1U) != 0) || (0.0 <= un->multiplier_)) {
    dVar3 = numericalRoot<double>(un->multiplier_,power);
    local_14 = un->base_units_;
    uVar1 = detail::unit_data::root(&local_14,power);
    uVar2 = (ulong)(uint)uVar1;
  }
  else {
    uVar2 = 0xfa94a488;
    dVar3 = NAN;
  }
  pVar4.base_units_ = (unit_data)(int)uVar2;
  pVar4.commodity_ = (int)(uVar2 >> 0x20);
  pVar4.multiplier_ = dVar3;
  return pVar4;
}

Assistant:

precise_unit root(const precise_unit& un, int power)
{
    if (power == 0) {
        return precise::one;
    }
    if (un.multiplier() < 0.0 && power % 2 == 0) {
        return precise::invalid;
    }
    return precise_unit{
        numericalRoot(un.multiplier(), power), un.base_units().root(power)};
}